

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMVirtualTotal(void)

{
  undefined1 local_78 [8];
  sysinfo memInfo;
  
  sysinfo((sysinfo *)local_78);
  return memInfo.bufferram * (uint)memInfo.freehigh;
}

Assistant:

int64_t npas4::GetRAMVirtualTotal()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return memInfo.ullTotalPageFile;
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	return static_cast<int64_t>(memInfo.totalswap) * static_cast<int64_t>(memInfo.mem_unit);
#endif
}